

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O1

void __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::StartVector<flatbuffers::Offset,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,size_t len,size_t elemsize,size_t alignment)

{
  NotNested(this);
  this->nested = true;
  PreAlign<unsigned_int>(this,len * elemsize);
  PreAlign(this,len * elemsize,alignment);
  return;
}

Assistant:

void StartVector(size_t len, size_t elemsize, size_t alignment) {
    NotNested();
    nested = true;
    // Align to the Length type of the vector (either 32-bit or 64-bit), so
    // that the length of the buffer can be added without padding.
    PreAlign<LenT>(len * elemsize);
    PreAlign(len * elemsize, alignment);  // Just in case elemsize > uoffset_t.
  }